

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_convert_rgb(uint *r_out,uint *g_out,uint *b_out,uint r_in,uint g_in,uint b_in,
                        LodePNGColorMode *mode_out,LodePNGColorMode *mode_in)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  uint j;
  uint i;
  uint shift;
  uint mul;
  uint b;
  uint g;
  uint r;
  uint b_in_local;
  uint g_in_local;
  uint r_in_local;
  uint *b_out_local;
  uint *g_out_local;
  uint *r_out_local;
  
  iVar1 = (int)(0xffff / (ulong)((1 << ((byte)mode_in->bitdepth & 0x1f)) - 1));
  bVar3 = 0x10 - (char)mode_out->bitdepth;
  if ((mode_in->colortype == LCT_GREY) || (mode_in->colortype == LCT_GREY_ALPHA)) {
    b = r_in * iVar1;
    g = b;
    r = b;
  }
  else if ((mode_in->colortype == LCT_RGB) || (mode_in->colortype == LCT_RGBA)) {
    r = r_in * iVar1;
    g = g_in * iVar1;
    b = b_in * iVar1;
  }
  else {
    if (mode_in->colortype != LCT_PALETTE) {
      return 0x1f;
    }
    if (mode_in->palettesize <= (ulong)r_in) {
      return 0x52;
    }
    r = (uint)mode_in->palette[r_in << 2] * 0x101;
    g = (uint)mode_in->palette[r_in * 4 + 1] * 0x101;
    b = (uint)mode_in->palette[r_in * 4 + 2] * 0x101;
  }
  if ((mode_out->colortype == LCT_GREY) || (mode_out->colortype == LCT_GREY_ALPHA)) {
    *r_out = r >> (bVar3 & 0x1f);
  }
  else {
    if ((mode_out->colortype != LCT_RGB) && (mode_out->colortype != LCT_RGBA)) {
      if (mode_out->colortype != LCT_PALETTE) {
        return 0x1f;
      }
      if (((r >> 8 == (r & 0xff)) && (g >> 8 == (g & 0xff))) && (b >> 8 == (b & 0xff))) {
        i = 0;
        while( true ) {
          if (mode_out->palettesize <= (ulong)i) {
            return 0x52;
          }
          uVar2 = i * 4;
          if (((r >> 8 == (uint)mode_out->palette[uVar2]) &&
              (g >> 8 == (uint)mode_out->palette[uVar2 + 1])) &&
             (b >> 8 == (uint)mode_out->palette[uVar2 + 2])) break;
          i = i + 1;
        }
        *r_out = i;
        return 0;
      }
      return 0x52;
    }
    *r_out = r >> (bVar3 & 0x1f);
    *g_out = g >> (bVar3 & 0x1f);
    *b_out = b >> (bVar3 & 0x1f);
  }
  return 0;
}

Assistant:

unsigned lodepng_convert_rgb(
    unsigned* r_out, unsigned* g_out, unsigned* b_out,
    unsigned r_in, unsigned g_in, unsigned b_in,
    const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in) {
  unsigned r = 0, g = 0, b = 0;
  unsigned mul = 65535 / ((1u << mode_in->bitdepth) - 1u); /*65535, 21845, 4369, 257, 1*/
  unsigned shift = 16 - mode_out->bitdepth;

  if(mode_in->colortype == LCT_GREY || mode_in->colortype == LCT_GREY_ALPHA) {
    r = g = b = r_in * mul;
  } else if(mode_in->colortype == LCT_RGB || mode_in->colortype == LCT_RGBA) {
    r = r_in * mul;
    g = g_in * mul;
    b = b_in * mul;
  } else if(mode_in->colortype == LCT_PALETTE) {
    if(r_in >= mode_in->palettesize) return 82;
    r = mode_in->palette[r_in * 4 + 0] * 257u;
    g = mode_in->palette[r_in * 4 + 1] * 257u;
    b = mode_in->palette[r_in * 4 + 2] * 257u;
  } else {
    return 31;
  }

  /* now convert to output format */
  if(mode_out->colortype == LCT_GREY || mode_out->colortype == LCT_GREY_ALPHA) {
    *r_out = r >> shift ;
  } else if(mode_out->colortype == LCT_RGB || mode_out->colortype == LCT_RGBA) {
    *r_out = r >> shift ;
    *g_out = g >> shift ;
    *b_out = b >> shift ;
  } else if(mode_out->colortype == LCT_PALETTE) {
    unsigned i;
    /* a 16-bit color cannot be in the palette */
    if((r >> 8) != (r & 255) || (g >> 8) != (g & 255) || (b >> 8) != (b & 255)) return 82;
    for(i = 0; i < mode_out->palettesize; i++) {
      unsigned j = i * 4;
      if((r >> 8) == mode_out->palette[j + 0] && (g >> 8) == mode_out->palette[j + 1] &&
          (b >> 8) == mode_out->palette[j + 2]) {
        *r_out = i;
        return 0;
      }
    }
    return 82;
  } else {
    return 31;
  }

  return 0;
}